

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::FixPlusObject::visitExpr(FixPlusObject *this,AST **expr)

{
  AST **ppAVar1;
  ApplyBrace *pAVar2;
  long *in_RSI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  AST *rhs;
  Binary *bin_op;
  AST **in_stack_00000278;
  CompilerPass *in_stack_00000280;
  Allocator *local_68;
  Fodder *in_stack_ffffffffffffffa8;
  AST *in_stack_ffffffffffffffb0;
  long local_48;
  AST *args_3;
  AST **ppAVar3;
  LocationRange *args;
  
  args = (LocationRange *)*in_RSI;
  if (args == (LocationRange *)0x0) {
    ppAVar1 = (AST **)0x0;
  }
  else {
    ppAVar1 = (AST **)__dynamic_cast(args,&AST::typeinfo,&Binary::typeinfo,0);
  }
  if (ppAVar1 != (AST **)0x0) {
    args_3 = ppAVar1[0x10];
    ppAVar3 = ppAVar1;
    if (args_3 == (AST *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = __dynamic_cast(args_3,&AST::typeinfo,&Var::typeinfo,0);
    }
    if (local_48 == 0) {
      in_stack_ffffffffffffffb0 = ppAVar1[0x10];
      if (in_stack_ffffffffffffffb0 == (AST *)0x0) {
        in_stack_ffffffffffffffa8 = (Fodder *)0x0;
      }
      else {
        in_stack_ffffffffffffffa8 =
             (Fodder *)__dynamic_cast(in_stack_ffffffffffffffb0,&AST::typeinfo,&Index::typeinfo,0);
      }
      if (in_stack_ffffffffffffffa8 == (Fodder *)0x0) goto LAB_0036c109;
    }
    if (ppAVar1[0x15] == (AST *)0x0) {
      local_68 = (Allocator *)0x0;
    }
    else {
      local_68 = (Allocator *)__dynamic_cast(ppAVar1[0x15],&AST::typeinfo,&Object::typeinfo,0);
    }
    if ((local_68 != (Allocator *)0x0) && (*(int *)(ppAVar1 + 0x14) == 3)) {
      fodder_move_front((Fodder *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pAVar2 = Allocator::
               make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
                         (local_68,args,in_RDI,ppAVar3,(AST **)args_3);
      *in_RSI = (long)pAVar2;
    }
  }
LAB_0036c109:
  CompilerPass::visitExpr(in_stack_00000280,in_stack_00000278);
  return;
}

Assistant:

void visitExpr(AST *&expr)
    {
        if (auto *bin_op = dynamic_cast<Binary *>(expr)) {
            // Could relax this to allow more ASTs on the LHS but this seems OK for now.
            if (dynamic_cast<Var *>(bin_op->left) || dynamic_cast<Index *>(bin_op->left)) {
                if (AST *rhs = dynamic_cast<Object *>(bin_op->right)) {
                    if (bin_op->op == BOP_PLUS) {
                        fodder_move_front(rhs->openFodder, bin_op->opFodder);
                        expr = alloc.make<ApplyBrace>(
                            bin_op->location, bin_op->openFodder, bin_op->left, rhs);
                    }
                }
            }
        }
        FmtPass::visitExpr(expr);
    }